

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct8_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i _in0;
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i _in1_1;
  undefined1 auVar5 [16];
  __m128i _in0_2;
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  __m128i _in0_1;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i _in0_3;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i _in1_7;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  __m128i _in1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i _in1_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i _in1_2;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  alVar4 = *input;
  alVar1 = input[1];
  alVar2 = input[2];
  auVar42._0_12_ = alVar1._0_12_;
  auVar42._12_2_ = alVar1[0]._6_2_;
  auVar42._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar38._12_4_ = auVar42._12_4_;
  auVar38._0_10_ = alVar1._0_10_;
  auVar38._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar30._10_6_ = auVar38._10_6_;
  auVar30._0_8_ = alVar1[0];
  auVar30._8_2_ = alVar1[0]._4_2_;
  auVar24._8_8_ = auVar30._8_8_;
  auVar24._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar24._4_2_ = alVar1[0]._2_2_;
  auVar24._0_2_ = (undefined2)alVar1[0];
  auVar24._2_2_ = (short)input[7][0];
  alVar1 = input[5];
  auVar32._8_4_ = 0xf04f031f;
  auVar32._0_8_ = 0xf04f031ff04f031f;
  auVar32._12_4_ = 0xf04f031f;
  auVar3 = pmaddwd(auVar32,auVar24);
  auVar11._8_4_ = 0x31f0fb1;
  auVar11._0_8_ = 0x31f0fb1031f0fb1;
  auVar11._12_4_ = 0x31f0fb1;
  auVar12 = pmaddwd(auVar11,auVar24);
  auVar22._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar13._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar12 = packssdw(auVar22,auVar22);
  auVar14 = packssdw(auVar13,auVar13);
  auVar20._0_12_ = alVar1._0_12_;
  auVar20._12_2_ = alVar1[0]._6_2_;
  auVar20._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._0_10_ = alVar1._0_10_;
  auVar19._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = alVar1[0];
  auVar18._8_2_ = alVar1[0]._4_2_;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar17._4_2_ = alVar1[0]._2_2_;
  auVar17._0_2_ = (undefined2)alVar1[0];
  auVar17._2_2_ = (short)input[3][0];
  auVar31._8_4_ = 0xf71c0d4e;
  auVar31._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar31._12_4_ = 0xf71c0d4e;
  auVar32 = pmaddwd(auVar31,auVar17);
  auVar43._8_4_ = 0xd4e08e4;
  auVar43._0_8_ = 0xd4e08e40d4e08e4;
  auVar43._12_4_ = 0xd4e08e4;
  auVar3 = pmaddwd(auVar43,auVar17);
  auVar33._0_4_ = auVar32._0_4_ + 0x800 >> 0xc;
  auVar33._4_4_ = auVar32._4_4_ + 0x800 >> 0xc;
  auVar33._8_4_ = auVar32._8_4_ + 0x800 >> 0xc;
  auVar33._12_4_ = auVar32._12_4_ + 0x800 >> 0xc;
  auVar5._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar5._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar5._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar5._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar34 = packssdw(auVar33,auVar33);
  auVar32 = packssdw(auVar5,auVar5);
  auVar9._0_12_ = alVar4._0_12_;
  auVar9._12_2_ = alVar4[0]._6_2_;
  auVar9._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = alVar4._0_10_;
  auVar8._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._0_8_ = alVar4[0];
  auVar7._8_2_ = alVar4[0]._4_2_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar6._4_2_ = alVar4[0]._2_2_;
  auVar6._0_2_ = (undefined2)alVar4[0];
  auVar6._2_2_ = (short)input[4][0];
  auVar21._8_4_ = 0xf4b00b50;
  auVar21._0_8_ = 0xf4b00b50f4b00b50;
  auVar21._12_4_ = 0xf4b00b50;
  auVar22 = pmaddwd(auVar21,auVar6);
  auVar3._8_4_ = 0xb500b50;
  auVar3._0_8_ = 0xb500b500b500b50;
  auVar3._12_4_ = 0xb500b50;
  auVar3 = pmaddwd(auVar6,auVar3);
  auVar10._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar10,auVar10);
  auVar29._0_12_ = alVar2._0_12_;
  auVar29._12_2_ = alVar2[0]._6_2_;
  auVar29._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar28._12_4_ = auVar29._12_4_;
  auVar28._0_10_ = alVar2._0_10_;
  auVar28._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar27._10_6_ = auVar28._10_6_;
  auVar27._0_8_ = alVar2[0];
  auVar27._8_2_ = alVar2[0]._4_2_;
  auVar26._8_8_ = auVar27._8_8_;
  auVar26._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar26._4_2_ = alVar2[0]._2_2_;
  auVar26._0_2_ = (undefined2)alVar2[0];
  auVar26._2_2_ = (short)input[6][0];
  auVar24 = packssdw(auVar23,auVar23);
  auVar36._8_4_ = 0xf138061f;
  auVar36._0_8_ = 0xf138061ff138061f;
  auVar36._12_4_ = 0xf138061f;
  auVar3 = pmaddwd(auVar36,auVar26);
  auVar39._8_4_ = 0x61f0ec8;
  auVar39._0_8_ = 0x61f0ec8061f0ec8;
  auVar39._12_4_ = 0x61f0ec8;
  auVar40 = pmaddwd(auVar39,auVar26);
  auVar37._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar41._0_4_ = auVar40._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar40._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar40._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar40._12_4_ + 0x800 >> 0xc;
  auVar38 = packssdw(auVar37,auVar37);
  auVar42 = packssdw(auVar41,auVar41);
  auVar30 = paddsw(auVar12,auVar34);
  auVar3 = psubsw(auVar12,auVar34);
  auVar12 = psubsw(auVar14,auVar32);
  auVar35._0_12_ = auVar3._0_12_;
  auVar35._12_2_ = auVar3._6_2_;
  auVar35._14_2_ = auVar12._6_2_;
  auVar25._12_4_ = auVar35._12_4_;
  auVar25._0_10_ = auVar3._0_10_;
  auVar25._10_2_ = auVar12._4_2_;
  auVar40._10_6_ = auVar25._10_6_;
  auVar40._0_8_ = auVar3._0_8_;
  auVar40._8_2_ = auVar3._4_2_;
  auVar34._8_8_ = auVar40._8_8_;
  auVar34._6_2_ = auVar12._2_2_;
  auVar34._4_2_ = auVar3._2_2_;
  auVar34._0_2_ = auVar3._0_2_;
  auVar34._2_2_ = auVar12._0_2_;
  auVar32 = paddsw(auVar32,auVar14);
  auVar43 = paddsw(auVar22,auVar42);
  auVar22 = psubsw(auVar22,auVar42);
  auVar35 = paddsw(auVar24,auVar38);
  auVar25 = psubsw(auVar24,auVar38);
  auVar15._8_4_ = 0xb50f4b0;
  auVar15._0_8_ = 0xb50f4b00b50f4b0;
  auVar15._12_4_ = 0xb50f4b0;
  auVar40 = pmaddwd(auVar15,auVar34);
  auVar12._8_4_ = 0xb500b50;
  auVar12._0_8_ = 0xb500b500b500b50;
  auVar12._12_4_ = 0xb500b50;
  auVar3 = pmaddwd(auVar34,auVar12);
  auVar16._0_4_ = auVar40._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar40._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar40._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar40._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar12 = packssdw(auVar16,auVar16);
  auVar3 = packssdw(auVar14,auVar14);
  alVar4 = (__m128i)paddsw(auVar43,auVar32);
  *output = alVar4;
  alVar4 = (__m128i)psubsw(auVar43,auVar32);
  output[7] = alVar4;
  alVar4 = (__m128i)paddsw(auVar35,auVar3);
  output[1] = alVar4;
  alVar4 = (__m128i)psubsw(auVar35,auVar3);
  output[6] = alVar4;
  alVar4 = (__m128i)paddsw(auVar25,auVar12);
  output[2] = alVar4;
  alVar4 = (__m128i)psubsw(auVar25,auVar12);
  output[5] = alVar4;
  alVar4 = (__m128i)paddsw(auVar22,auVar30);
  output[3] = alVar4;
  alVar4 = (__m128i)psubsw(auVar22,auVar30);
  output[4] = alVar4;
  return;
}

Assistant:

static void idct8_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[0];
  x[1] = input[4];
  x[2] = input[2];
  x[3] = input[6];
  x[4] = input[1];
  x[5] = input[5];
  x[6] = input[3];
  x[7] = input[7];

  // stage 2
  btf_16_4p_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_4p_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);

  // stage 3
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);

  // stage 4
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);

  // stage 5
  btf_16_adds_subs_out_sse2(output[0], output[7], x[0], x[7]);
  btf_16_adds_subs_out_sse2(output[1], output[6], x[1], x[6]);
  btf_16_adds_subs_out_sse2(output[2], output[5], x[2], x[5]);
  btf_16_adds_subs_out_sse2(output[3], output[4], x[3], x[4]);
}